

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O0

ecs_iter_t *
ecs_scope_iter(ecs_iter_t *__return_storage_ptr__,ecs_world_t *world,ecs_entity_t parent)

{
  undefined1 local_70 [8];
  ecs_scope_iter_t iter;
  ecs_entity_t parent_local;
  ecs_world_t *world_local;
  
  iter.table.references = (ecs_ref_t *)parent;
  memset(local_70,0,0x58);
  iter.filter._16_8_ = _ecs_map_get_ptr(world->child_tables,(ecs_map_key_t)iter.table.references);
  __return_storage_ptr__->world = world;
  __return_storage_ptr__->real_world = (ecs_world_t *)0x0;
  __return_storage_ptr__->system = 0;
  __return_storage_ptr__->kind = EcsQuerySimpleIter;
  __return_storage_ptr__->table = (ecs_iter_table_t *)0x0;
  __return_storage_ptr__->query = (ecs_query_t *)0x0;
  __return_storage_ptr__->table_count = 0;
  __return_storage_ptr__->inactive_table_count = 0;
  __return_storage_ptr__->column_count = 0;
  __return_storage_ptr__->table_columns = (void *)0x0;
  __return_storage_ptr__->entities = (ecs_entity_t *)0x0;
  __return_storage_ptr__->param = (void *)0x0;
  __return_storage_ptr__->delta_time = 0.0;
  __return_storage_ptr__->delta_system_time = 0.0;
  __return_storage_ptr__->world_time = 0.0;
  __return_storage_ptr__->frame_offset = 0;
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->count = 0;
  __return_storage_ptr__->total_count = 0;
  __return_storage_ptr__->triggered_by = (ecs_entities_t *)0x0;
  __return_storage_ptr__->interrupted_by = 0;
  memcpy(&__return_storage_ptr__->iter,local_70,0x58);
  return __return_storage_ptr__;
}

Assistant:

ecs_iter_t ecs_scope_iter(
    ecs_world_t *world,
    ecs_entity_t parent)
{
    ecs_scope_iter_t iter = {
        .tables = ecs_map_get_ptr(world->child_tables, ecs_vector_t*, parent),
        .index = 0
    };

    return (ecs_iter_t) {
        .world = world,
        .iter.parent = iter
    };
}